

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

shared_ptr<aeron::Subscription> __thiscall
aeron::archive::AeronArchive::replay
          (AeronArchive *this,int64_t recordingId,int64_t position,int64_t length,
          string *replayChannel,int32_t replayStreamId,on_available_image_t *availableImageHandler,
          on_unavailable_image_t *unavailableImageHandler)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_0000008c;
  shared_ptr<aeron::Subscription> sVar3;
  on_unavailable_image_t *in_stack_00000018;
  undefined1 local_88 [40];
  int64_t subId;
  string updatedReplayChannel;
  int64_t replaySessionId;
  string *replayChannel_local;
  int64_t length_local;
  int64_t position_local;
  int64_t recordingId_local;
  AeronArchive *this_local;
  shared_ptr<aeron::Subscription> *subscription;
  
  updatedReplayChannel.field_2._8_8_ =
       startReplay((AeronArchive *)recordingId,position,length,(int64_t)replayChannel,
                   (string *)CONCAT44(in_register_0000008c,replayStreamId),
                   (int32_t)availableImageHandler);
  ChannelUri::addSessionId
            ((string *)&subId,(string *)CONCAT44(in_register_0000008c,replayStreamId),
             updatedReplayChannel.field_2._8_4_);
  peVar2 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )(recordingId + 0x128));
  local_88._32_8_ =
       Aeron::addSubscription
                 (peVar2,(string *)&subId,(int32_t)availableImageHandler,unavailableImageHandler,
                  in_stack_00000018);
  local_88[0x13] = 0;
  std::shared_ptr<aeron::Subscription>::shared_ptr((shared_ptr<aeron::Subscription> *)this);
  while( true ) {
    peVar2 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(recordingId + 0x128));
    Aeron::findSubscription((Aeron *)local_88,(int64_t)peVar2);
    this_00 = (__shared_ptr *)
              std::shared_ptr<aeron::Subscription>::operator=
                        ((shared_ptr<aeron::Subscription> *)this,
                         (shared_ptr<aeron::Subscription> *)local_88);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    std::shared_ptr<aeron::Subscription>::~shared_ptr((shared_ptr<aeron::Subscription> *)local_88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::this_thread::yield();
  }
  local_88[0x13] = 1;
  std::__cxx11::string::~string((string *)&subId);
  sVar3.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Subscription>)
         sVar3.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<aeron::Subscription> AeronArchive::replay(std::int64_t recordingId, std::int64_t position,
                                                          std::int64_t length, const std::string& replayChannel,
                                                          std::int32_t replayStreamId,
                                                          aeron::on_available_image_t&& availableImageHandler,
                                                          aeron::on_unavailable_image_t&& unavailableImageHandler) {
    std::int64_t replaySessionId = startReplay(recordingId, position, length, replayChannel, replayStreamId);

    std::string updatedReplayChannel = ChannelUri::addSessionId(replayChannel, replaySessionId);

    // wait for the subscription to become available
    std::int64_t subId = aeron_->addSubscription(updatedReplayChannel, replayStreamId, std::move(availableImageHandler),
                                                 std::move(unavailableImageHandler));

    std::shared_ptr<Subscription> subscription;
    while (!(subscription = aeron_->findSubscription(subId))) {
        std::this_thread::yield();
    }

    return subscription;
}